

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::DockNodeIsDropAllowed
               (ImGuiWindow_conflict *host_window,ImGuiWindow_conflict *root_payload)

{
  ImGuiDockNode *pIVar1;
  bool bVar2;
  bool bVar3;
  ImGuiWindow_conflict **ppIVar4;
  ImGuiWindow_conflict *payload;
  int iVar5;
  int i;
  
  pIVar1 = root_payload->DockNodeAsHost;
  if (pIVar1 == (ImGuiDockNode *)0x0) {
    iVar5 = 1;
  }
  else {
    if (pIVar1->ChildNodes[0] != (ImGuiDockNode *)0x0) {
      return true;
    }
    iVar5 = (pIVar1->Windows).Size;
  }
  i = 0;
  if (iVar5 < 1) {
    iVar5 = i;
  }
  do {
    bVar2 = iVar5 != i;
    if (iVar5 == i) {
      return bVar2;
    }
    payload = root_payload;
    if (root_payload->DockNodeAsHost != (ImGuiDockNode *)0x0) {
      ppIVar4 = ImVector<ImGuiWindow_*>::operator[]
                          ((ImVector<ImGuiWindow_*> *)&root_payload->DockNodeAsHost->Windows,i);
      payload = *ppIVar4;
    }
    bVar3 = DockNodeIsDropAllowedOne(payload,host_window);
    i = i + 1;
  } while (!bVar3);
  return bVar2;
}

Assistant:

static bool ImGui::DockNodeIsDropAllowed(ImGuiWindow* host_window, ImGuiWindow* root_payload)
{
    if (root_payload->DockNodeAsHost && root_payload->DockNodeAsHost->IsSplitNode())
        return true;

    const int payload_count = root_payload->DockNodeAsHost ? root_payload->DockNodeAsHost->Windows.Size : 1;
    for (int payload_n = 0; payload_n < payload_count; payload_n++)
    {
        ImGuiWindow* payload = root_payload->DockNodeAsHost ? root_payload->DockNodeAsHost->Windows[payload_n] : root_payload;
        if (DockNodeIsDropAllowedOne(payload, host_window))
            return true;
    }
    return false;
}